

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memplumber.cpp
# Opt level: O1

char * getCaller(void)

{
  uint uVar1;
  char *pcVar2;
  long lVar3;
  void *backtraceArr [3];
  undefined1 auStack_18 [24];
  
  uVar1 = backtrace(auStack_18,3);
  if (uVar1 < 3) {
    pcVar2 = "Unknown";
  }
  else {
    lVar3 = backtrace_symbols(auStack_18,uVar1);
    pcVar2 = *(char **)(lVar3 + 0x10);
  }
  return pcVar2;
}

Assistant:

const char* getCaller() {
    void* backtraceArr[3];
    size_t backtraceArrSize;

    // get void*'s for all entries on the stack
    backtraceArrSize = backtrace(backtraceArr, 3);

    if (backtraceArrSize < 3) {
        return "Unknown";
    }

    // get the symbols
    char** backtraceSymbols = backtrace_symbols(backtraceArr, backtraceArrSize);

    // the caller is second in the backtrace
    return backtraceSymbols[2];
}